

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

Fad<float> * __thiscall
TPZMatrix<Fad<float>_>::MatrixNorm
          (Fad<float> *__return_storage_ptr__,TPZMatrix<Fad<float>_> *this,int p,int64_t numiter,
          REAL tol)

{
  Fad<float> *pFVar1;
  long lVar2;
  Fad<float> *pFVar3;
  bool bVar4;
  ostream *poVar5;
  ulong *puVar6;
  float *pfVar7;
  ulong uVar8;
  Fad<float> *pFVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  float fVar15;
  float fVar16;
  Fad<float> sum;
  TPZVec<Fad<float>_> EigenVal;
  TPZFMatrix<Fad<float>_> transp;
  TPZVec<Fad<float>_> ROW;
  undefined1 local_170 [8];
  undefined1 local_168 [16];
  float local_158;
  undefined4 uStack_154;
  float local_150 [2];
  _func_int **local_148;
  long local_140;
  REAL local_138;
  int64_t local_130;
  Fad<float> *local_128;
  TPZVec<Fad<float>_> local_120;
  TPZFMatrix<Fad<float>_> local_100;
  TPZVec<Fad<float>_> local_70;
  Fad<float> local_50;
  
  lVar2 = (this->super_TPZBaseMatrix).fRow;
  if (lVar2 != 0) {
    local_138 = tol;
    local_130 = numiter;
    if (lVar2 != (this->super_TPZBaseMatrix).fCol) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "TVar TPZMatrix<Fad<float>>::MatrixNorm(int, int64_t, REAL) const [T = Fad<float>]"
                 ,0x51);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr," - matrix must be square - Rows() = ",0x24);
      poVar5 = std::ostream::_M_insert<long>((long)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," - Cols() = ",0xc);
      poVar5 = std::ostream::_M_insert<long>((long)poVar5);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
    if (p == 2) {
      local_100.super_TPZMatrix<Fad<float>_>.super_TPZBaseMatrix.fDecomposed = '\0';
      local_100.super_TPZMatrix<Fad<float>_>.super_TPZBaseMatrix.fDefPositive = '\0';
      local_100.super_TPZMatrix<Fad<float>_>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)&PTR__TPZFMatrix_0181e818;
      local_100.fElem = (Fad<float> *)0x0;
      local_100.fGiven = (Fad<float> *)0x0;
      local_100.fSize = 0;
      local_128 = __return_storage_ptr__;
      local_100.super_TPZMatrix<Fad<float>_>.super_TPZBaseMatrix.fRow = lVar2;
      local_100.super_TPZMatrix<Fad<float>_>.super_TPZBaseMatrix.fCol = lVar2;
      TPZVec<int>::TPZVec(&local_100.fPivot.super_TPZVec<int>,0);
      local_100.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
      local_100.fPivot.super_TPZVec<int>.fStore = local_100.fPivot.fExtAlloc;
      local_100.fPivot.super_TPZVec<int>.fNElements = 0;
      local_100.fPivot.super_TPZVec<int>.fNAlloc = 0;
      local_148 = (_func_int **)&PTR__TPZVec_0181eb08;
      local_100.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0181eb08;
      local_100.fWork.fStore = (Fad<float> *)0x0;
      local_100.fWork.fNElements = 0;
      local_100.fWork.fNAlloc = 0;
      uVar8 = lVar2 * lVar2;
      puVar6 = (ulong *)operator_new__(-(ulong)(uVar8 >> 0x3b != 0) | uVar8 * 0x20 | 8);
      *puVar6 = uVar8;
      pFVar1 = (Fad<float> *)(puVar6 + 1);
      lVar12 = 0;
      pFVar9 = pFVar1;
      do {
        Fad<float>::Fad(pFVar9);
        lVar12 = lVar12 + -0x20;
        pFVar9 = pFVar9 + 1;
      } while (-lVar12 != uVar8 * 0x20);
      local_100.fElem = pFVar1;
      if (0 < lVar2) {
        lVar12 = 0;
        do {
          lVar14 = 0;
          do {
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])
                      ((Fad<float> *)local_170,this,lVar14,lVar12);
            pFVar1 = local_100.fElem;
            if ((local_100.super_TPZMatrix<Fad<float>_>.super_TPZBaseMatrix.fRow <= lVar12) ||
               (local_100.super_TPZMatrix<Fad<float>_>.super_TPZBaseMatrix.fCol <= lVar14)) {
              TPZFMatrix<Fad<float>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds")
              ;
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar10 = local_100.super_TPZMatrix<Fad<float>_>.super_TPZBaseMatrix.fRow * lVar14;
            local_100.fElem[lVar10 + lVar12].val_ = (float)local_170._0_4_;
            Vector<float>::operator=
                      (&local_100.fElem[lVar10 + lVar12].dx_,(Vector<float> *)local_168);
            pFVar1[lVar10 + lVar12].defaultVal = local_158;
            Fad<float>::~Fad((Fad<float> *)local_170);
            lVar14 = lVar14 + 1;
          } while (lVar2 != lVar14);
          lVar12 = lVar12 + 1;
        } while (lVar12 != lVar2);
      }
      TPZVec<Fad<float>_>::TPZVec(&local_70,lVar2);
      if (0 < lVar2) {
        lVar12 = 0;
        do {
          lVar14 = 0;
          lVar10 = 0;
          local_140 = lVar12;
          do {
            pFVar9 = local_70.fStore;
            pFVar1 = local_100.fElem;
            if ((local_100.super_TPZMatrix<Fad<float>_>.super_TPZBaseMatrix.fRow <= local_140) ||
               (local_100.super_TPZMatrix<Fad<float>_>.super_TPZBaseMatrix.fCol <= lVar10)) {
              TPZFMatrix<Fad<float>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds")
              ;
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar11 = local_100.super_TPZMatrix<Fad<float>_>.super_TPZBaseMatrix.fRow * lVar10;
            pfVar7 = (float *)((long)&(local_70.fStore)->val_ + lVar14);
            *pfVar7 = local_100.fElem[lVar11 + lVar12].val_;
            Vector<float>::operator=
                      ((Vector<float> *)(pfVar7 + 2),&local_100.fElem[lVar11 + lVar12].dx_);
            *(float *)((long)&pFVar9->defaultVal + lVar14) = pFVar1[lVar11 + lVar12].defaultVal;
            lVar10 = lVar10 + 1;
            lVar14 = lVar14 + 0x20;
          } while (lVar2 != lVar10);
          lVar14 = 0;
          do {
            local_170._0_4_ = 0.0;
            local_168._0_4_ = 0.0;
            local_168._8_8_ = (float *)0x0;
            local_158 = 0.0;
            lVar10 = 0;
            lVar11 = 0;
            do {
              pFVar1 = local_70.fStore;
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])
                        (&local_50,this,lVar11,lVar14);
              local_120._vptr_TPZVec = (_func_int **)((long)&pFVar1->val_ + lVar10);
              local_120.fStore = &local_50;
              Fad<float>::operator+=
                        ((Fad<float> *)local_170,
                         (FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_> *)&local_120);
              Fad<float>::~Fad(&local_50);
              pFVar1 = local_100.fElem;
              lVar11 = lVar11 + 1;
              lVar10 = lVar10 + 0x20;
            } while (lVar2 != lVar11);
            if ((local_100.super_TPZMatrix<Fad<float>_>.super_TPZBaseMatrix.fRow <= local_140) ||
               (local_100.super_TPZMatrix<Fad<float>_>.super_TPZBaseMatrix.fCol <= lVar14)) {
              TPZFMatrix<Fad<float>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds")
              ;
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar10 = local_100.super_TPZMatrix<Fad<float>_>.super_TPZBaseMatrix.fRow * lVar14;
            local_100.fElem[lVar10 + lVar12].val_ = (float)local_170._0_4_;
            Vector<float>::operator=
                      (&local_100.fElem[lVar10 + lVar12].dx_,(Vector<float> *)local_168);
            pFVar1[lVar10 + lVar12].defaultVal = local_158;
            Fad<float>::~Fad((Fad<float> *)local_170);
            lVar14 = lVar14 + 1;
          } while (lVar14 != lVar2);
          lVar12 = local_140 + 1;
        } while (lVar12 != lVar2);
      }
      local_120._vptr_TPZVec = local_148;
      local_120.fStore = (Fad<float> *)0x0;
      local_120.fNElements = 0;
      local_120.fNAlloc = 0;
      bVar4 = SolveEigenvaluesJacobi
                        (&local_100.super_TPZMatrix<Fad<float>_>,&local_130,&local_138,&local_120);
      if (!bVar4) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "TVar TPZMatrix<Fad<float>>::MatrixNorm(int, int64_t, REAL) const [T = Fad<float>]"
                   ,0x51);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr," - it was not possible to find Eigenvalues. Iterations = "
                   ,0x39);
        poVar5 = std::ostream::_M_insert<long>((long)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," - error found = ",0x11);
        poVar5 = std::ostream::_M_insert<double>(local_138);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
      }
      FadFuncSqrt<Fad<float>_>::FadFuncSqrt((FadFuncSqrt<Fad<float>_> *)&local_50,local_120.fStore);
      pFVar1 = local_128;
      FadExpr<FadFuncSqrt<Fad<float>_>_>::FadExpr
                ((FadExpr<FadFuncSqrt<Fad<float>_>_> *)local_170,
                 (FadFuncSqrt<Fad<float>_> *)&local_50);
      Fad<float>::~Fad(&local_50);
      if ((float)local_168._0_4_ < 0.0) {
        fVar15 = sqrtf((float)local_168._0_4_);
      }
      else {
        fVar15 = SQRT((float)local_168._0_4_);
      }
      pFVar1->val_ = fVar15;
      (pFVar1->dx_).num_elts = 0;
      (pFVar1->dx_).ptr_to_data = (float *)0x0;
      if ((long)(int)local_168._8_4_ < 1) {
        pFVar1->defaultVal = 0.0;
      }
      else {
        (pFVar1->dx_).num_elts = local_168._8_4_;
        uVar8 = (long)(int)local_168._8_4_ * 4;
        pfVar7 = (float *)operator_new__(uVar8);
        (pFVar1->dx_).ptr_to_data = pfVar7;
        pFVar1->defaultVal = 0.0;
        uVar13 = 0;
        do {
          pfVar7 = (float *)(CONCAT44(uStack_154,local_158) + uVar13);
          if (local_168._8_4_ == 0) {
            pfVar7 = local_150;
          }
          fVar15 = *pfVar7;
          if ((float)local_168._0_4_ < 0.0) {
            fVar16 = sqrtf((float)local_168._0_4_);
          }
          else {
            fVar16 = SQRT((float)local_168._0_4_);
          }
          *(float *)((long)(pFVar1->dx_).ptr_to_data + uVar13) = fVar15 / (fVar16 + fVar16);
          uVar13 = uVar13 + 4;
        } while (uVar8 != uVar13);
      }
      Fad<float>::~Fad((Fad<float> *)local_168);
      pFVar9 = local_120.fStore;
      local_120._vptr_TPZVec = local_148;
      if (local_120.fStore != (Fad<float> *)0x0) {
        pFVar3 = local_120.fStore + -1;
        lVar2 = *(long *)&local_120.fStore[-1].defaultVal;
        if (lVar2 != 0) {
          lVar12 = lVar2 << 5;
          do {
            Fad<float>::~Fad((Fad<float> *)((long)&pFVar9[-1].val_ + lVar12));
            lVar12 = lVar12 + -0x20;
          } while (lVar12 != 0);
        }
        operator_delete__(&pFVar3->defaultVal,lVar2 << 5 | 8);
      }
      local_70._vptr_TPZVec = local_148;
      if (local_70.fStore != (Fad<float> *)0x0) {
        lVar2 = *(long *)&local_70.fStore[-1].defaultVal;
        if (lVar2 != 0) {
          lVar12 = lVar2 << 5;
          do {
            Fad<float>::~Fad((Fad<float> *)((long)&local_70.fStore[-1].val_ + lVar12));
            lVar12 = lVar12 + -0x20;
          } while (lVar12 != 0);
        }
        operator_delete__(&local_70.fStore[-1].defaultVal,lVar2 << 5 | 8);
      }
      TPZFMatrix<Fad<float>_>::~TPZFMatrix(&local_100);
      return pFVar1;
    }
    if (p == 1) {
      __return_storage_ptr__->val_ = 0.0;
      (__return_storage_ptr__->dx_).num_elts = 0;
      (__return_storage_ptr__->dx_).ptr_to_data = (float *)0x0;
      __return_storage_ptr__->defaultVal = 0.0;
      if (lVar2 < 1) {
        return __return_storage_ptr__;
      }
      lVar12 = 0;
      do {
        fVar15 = 0.0;
        lVar14 = 0;
        do {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])
                    (&local_100,this,lVar14,lVar12);
          fVar15 = fVar15 + ABS(local_100.super_TPZMatrix<Fad<float>_>.super_TPZBaseMatrix.
                                super_TPZSavable._vptr_TPZSavable._0_4_);
          Fad<float>::~Fad((Fad<float> *)&local_100);
          lVar14 = lVar14 + 1;
        } while (lVar2 != lVar14);
        if ((ABS(__return_storage_ptr__->val_) < fVar15) &&
           (__return_storage_ptr__->val_ = fVar15, (__return_storage_ptr__->dx_).num_elts != 0)) {
          local_100.super_TPZMatrix<Fad<float>_>.super_TPZBaseMatrix.super_TPZSavable.
          _vptr_TPZSavable =
               local_100.super_TPZMatrix<Fad<float>_>.super_TPZBaseMatrix.super_TPZSavable.
               _vptr_TPZSavable & 0xffffffff00000000;
          Vector<float>::operator=(&__return_storage_ptr__->dx_,(float *)&local_100);
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != lVar2);
      return __return_storage_ptr__;
    }
    if (p == 0) {
      __return_storage_ptr__->val_ = 0.0;
      (__return_storage_ptr__->dx_).num_elts = 0;
      (__return_storage_ptr__->dx_).ptr_to_data = (float *)0x0;
      __return_storage_ptr__->defaultVal = 0.0;
      if (lVar2 < 1) {
        return __return_storage_ptr__;
      }
      lVar12 = 0;
      do {
        fVar15 = 0.0;
        lVar14 = 0;
        do {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])
                    (&local_100,this,lVar12,lVar14);
          fVar15 = fVar15 + ABS(local_100.super_TPZMatrix<Fad<float>_>.super_TPZBaseMatrix.
                                super_TPZSavable._vptr_TPZSavable._0_4_);
          Fad<float>::~Fad((Fad<float> *)&local_100);
          lVar14 = lVar14 + 1;
        } while (lVar2 != lVar14);
        if ((ABS(__return_storage_ptr__->val_) < fVar15) &&
           (__return_storage_ptr__->val_ = fVar15, (__return_storage_ptr__->dx_).num_elts != 0)) {
          local_100.super_TPZMatrix<Fad<float>_>.super_TPZBaseMatrix.super_TPZSavable.
          _vptr_TPZSavable =
               local_100.super_TPZMatrix<Fad<float>_>.super_TPZBaseMatrix.super_TPZSavable.
               _vptr_TPZSavable & 0xffffffff00000000;
          Vector<float>::operator=(&__return_storage_ptr__->dx_,(float *)&local_100);
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != lVar2);
      return __return_storage_ptr__;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "TVar TPZMatrix<Fad<float>>::MatrixNorm(int, int64_t, REAL) const [T = Fad<float>]",
               0x51);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," p = ",5);
    poVar5 = (ostream *)std::ostream::operator<<(&std::cerr,p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," is not a correct option",0x18);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  __return_storage_ptr__->val_ = 0.0;
  (__return_storage_ptr__->dx_).num_elts = 0;
  (__return_storage_ptr__->dx_).ptr_to_data = (float *)0x0;
  __return_storage_ptr__->defaultVal = 0.0;
  return __return_storage_ptr__;
}

Assistant:

TVar TPZMatrix<TVar>::MatrixNorm(int p, int64_t numiter, REAL tol) const{
	const int64_t n = this->Rows();
	if (!n) return 0.;
	if (n != this->Cols()){
		PZError << __PRETTY_FUNCTION__
		<< " - matrix must be square - Rows() = "
		<< this->Rows() << " - Cols() = "
		<< this->Cols() << std::endl;
	}
	switch(p){
		case 0:{
			TVar max = 0.;
			int64_t i, j;
			for(i = 0; i < n; i++){
				REAL sum = 0.;
				for(j = 0; j < n; j++) sum += fabs( this->Get(i,j) );
				if (sum > fabs(max)) max = sum;
			}
			return max;
		}
		case 1:{
			TVar max = 0.;
			int64_t i, j;
			for(i = 0; i < n; i++){
				REAL sum = 0.;
				for(j = 0; j < n; j++) sum += fabs( this->Get(j,i) );
				if (sum > fabs(max)) max = sum;
			}
			return max;
		}
		case 2:{
			TPZFMatrix<TVar> transp(n,n);
			int64_t i, j, k;
			//TRANSPOSE
			for(i = 0; i < n; i++) for(j = 0; j < n; j++) transp(i,j) = this->Get(j,i);
			//MULTIPLY transp = transp.this
			TPZVec<TVar> ROW(n);
			for(i = 0; i < n; i++){
				for(j = 0; j < n; j++) ROW[j] = transp(i,j);
				for(j = 0; j < n; j++){
					TVar sum = 0.;
					for(k = 0; k < n; k++){
						sum += ROW[k] * this->Get(k,j);
					}//for k
					transp(i,j) = sum;
				}//for j
			}//for i
			
			TPZVec<TVar> EigenVal;
			bool result = transp.SolveEigenvaluesJacobi(numiter, tol, &EigenVal);
			if (result == false) PZError << __PRETTY_FUNCTION__
				<< " - it was not possible to find Eigenvalues. Iterations = "
				<< numiter << " - error found = " << tol << std::endl;
			return sqrt(EigenVal[0]);
		}//case 2
		default:{
			PZError << __PRETTY_FUNCTION__ << " p = " << p << " is not a correct option" << std::endl;
		}
	}//switch
	return 0.;
}